

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TableModel.cpp
# Opt level: O3

QVariant * __thiscall
TableModel::headerData
          (QVariant *__return_storage_ptr__,TableModel *this,int section,Orientation orientation,
          int role)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ulong uVar6;
  undefined8 extraout_RAX;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 uStack_40;
  anon_union_24_3_e3d07ef4_for_data local_38;
  undefined8 uStack_20;
  
  (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
  *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  if (((role & 0xfffffffdU) == 0) && (this->m_supplyHeaderData == true)) {
    uVar6 = (ulong)section;
    if (orientation == Horizontal) {
      uVar1 = (this->m_horizontalHeaderData).d.size;
      if ((long)uVar1 <= (long)uVar6) {
        return __return_storage_ptr__;
      }
      if (uVar1 <= uVar6) {
        headerData();
LAB_00104200:
        headerData();
        QVariant::~QVariant(__return_storage_ptr__);
        _Unwind_Resume(extraout_RAX);
      }
      QVariant::QVariant((QVariant *)&local_58,(this->m_horizontalHeaderData).d.ptr + uVar6);
    }
    else {
      uVar1 = (this->m_verticalHeaderData).d.size;
      if ((long)uVar1 <= (long)uVar6) {
        return __return_storage_ptr__;
      }
      if (uVar1 <= uVar6) goto LAB_00104200;
      QVariant::QVariant((QVariant *)&local_58,(this->m_verticalHeaderData).d.ptr + uVar6);
    }
    uVar5 = uStack_40;
    uVar4 = local_58._16_8_;
    uVar3 = local_58._8_8_;
    uVar2 = local_58.shared;
    local_58.shared = (PrivateShared *)0x0;
    local_58._8_8_ = 0;
    local_58._16_8_ = 0;
    uStack_40 = 2;
    local_38.shared = (__return_storage_ptr__->d).data.shared;
    local_38._8_8_ = *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8);
    local_38._16_8_ = *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10);
    uStack_20 = *(undefined8 *)&(__return_storage_ptr__->d).field_0x18;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = uVar4;
    *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = uVar5;
    (__return_storage_ptr__->d).data.shared = (PrivateShared *)uVar2;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = uVar3;
    QVariant::~QVariant((QVariant *)&local_38);
    QVariant::~QVariant((QVariant *)&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

QVariant TableModel::headerData(int section, Qt::Orientation orientation, int role) const
{
    QVariant result;

    switch (role) {
    case Qt::DisplayRole:
    case Qt::EditRole:
        if (m_supplyHeaderData) {
            if (orientation == Qt::Horizontal) { // column header data:
                if (section < m_horizontalHeaderData.count())
                    result = m_horizontalHeaderData[section];
            } else {
                // row header data:
                if (section < m_verticalHeaderData.count())
                    result = m_verticalHeaderData[section];
            }
        }
        break;
    // case Qt::TextAlignmentRole:
    //         result = QVariant ( Qt::AlignHCenter | Qt::AlignHCenter );
    // break;
    default:
        break;
    }
    return result;
}